

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__gif_header(stbi__context *s,stbi__gif *g,int *comp,int is_info)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  byte bVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  
  sVar1 = stbi__get8(s);
  if (((((sVar1 == 'G') && (sVar1 = stbi__get8(s), sVar1 == 'I')) &&
       (sVar1 = stbi__get8(s), sVar1 == 'F')) && (sVar1 = stbi__get8(s), sVar1 == '8')) &&
     (((sVar1 = stbi__get8(s), sVar1 == '7' || (sVar1 == '9')) &&
      (sVar1 = stbi__get8(s), sVar1 == 'a')))) {
    *(char **)(in_FS_OFFSET + -0x10) = "";
    sVar1 = stbi__get8(s);
    sVar2 = stbi__get8(s);
    g->w = (uint)CONCAT11(sVar2,sVar1);
    sVar1 = stbi__get8(s);
    sVar2 = stbi__get8(s);
    g->h = (uint)CONCAT11(sVar2,sVar1);
    bVar3 = stbi__get8(s);
    g->flags = (uint)bVar3;
    bVar3 = stbi__get8(s);
    g->bgindex = (uint)bVar3;
    bVar3 = stbi__get8(s);
    g->ratio = (uint)bVar3;
    g->transparent = -1;
    if ((g->w < 0x1000001) && (g->h < 0x1000001)) {
      if (comp != (int *)0x0) {
        *comp = 4;
      }
      if (is_info != 0) {
        return 1;
      }
      bVar3 = (byte)g->flags;
      if (-1 < (char)bVar3) {
        return 1;
      }
      stbi__gif_parse_colortable(s,g->pal,2 << (bVar3 & 7),-1);
      return 1;
    }
    pcVar4 = "too large";
  }
  else {
    pcVar4 = "not GIF";
  }
  *(char **)(in_FS_OFFSET + -0x10) = pcVar4;
  return 0;
}

Assistant:

static int stbi__gif_header(stbi__context *s, stbi__gif *g, int *comp, int is_info)
{
   stbi_uc version;
   if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8')
      return stbi__err("not GIF", "Corrupt GIF");

   version = stbi__get8(s);
   if (version != '7' && version != '9')    return stbi__err("not GIF", "Corrupt GIF");
   if (stbi__get8(s) != 'a')                return stbi__err("not GIF", "Corrupt GIF");

   stbi__g_failure_reason = "";
   g->w = stbi__get16le(s);
   g->h = stbi__get16le(s);
   g->flags = stbi__get8(s);
   g->bgindex = stbi__get8(s);
   g->ratio = stbi__get8(s);
   g->transparent = -1;

   if (g->w > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (g->h > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");

   if (comp != 0) *comp = 4;  // can't actually tell whether it's 3 or 4 until we parse the comments

   if (is_info) return 1;

   if (g->flags & 0x80)
      stbi__gif_parse_colortable(s,g->pal, 2 << (g->flags & 7), -1);

   return 1;
}